

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BondOrderParameter.cpp
# Opt level: O1

void __thiscall OpenMD::BondOrderParameter::initializeHistogram(BondOrderParameter *this)

{
  mapped_type *pmVar1;
  long lVar2;
  key_type kVar3;
  key_type local_48;
  key_type local_40;
  map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
  *local_38;
  
  if (0 < this->nBins_) {
    local_38 = &this->W_histogram_;
    kVar3.first = 0;
    kVar3.second = 0;
    do {
      lVar2 = 0xd;
      local_40 = kVar3;
      do {
        local_48 = kVar3;
        pmVar1 = std::
                 map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
                 ::operator[](&this->Q_histogram_,&local_48);
        *pmVar1 = 0;
        local_48 = kVar3;
        pmVar1 = std::
                 map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
                 ::operator[](local_38,&local_48);
        *pmVar1 = 0;
        kVar3 = (key_type)((long)kVar3 + 0x100000000);
        lVar2 = lVar2 + -1;
      } while (lVar2 != 0);
      kVar3 = (key_type)((long)local_40 + 1);
    } while ((long)kVar3 < (long)this->nBins_);
  }
  return;
}

Assistant:

void BondOrderParameter::initializeHistogram() {
    for (int bin = 0; bin < nBins_; bin++) {
      for (int l = 0; l <= lMax_; l++) {
        Q_histogram_[std::make_pair(bin, l)] = 0;
        W_histogram_[std::make_pair(bin, l)] = 0;
      }
    }
  }